

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlib.c
# Opt level: O0

void outbits(Outbuf *out,unsigned_long bits,int nbits)

{
  int nbits_local;
  unsigned_long bits_local;
  Outbuf *out_local;
  
  if (out->noutbits + nbits < 0x21) {
    out->outbits = bits << ((byte)out->noutbits & 0x3f) | out->outbits;
    out->noutbits = nbits + out->noutbits;
    while (7 < out->noutbits) {
      BinarySink_put_byte(out->outbuf->binarysink_,(uchar)out->outbits);
      out->outbits = out->outbits >> 8;
      out->noutbits = out->noutbits + -8;
    }
    return;
  }
  __assert_fail("out->noutbits + nbits <= 32",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/zlib.c",0x161
                ,"void outbits(struct Outbuf *, unsigned long, int)");
}

Assistant:

static void outbits(struct Outbuf *out, unsigned long bits, int nbits)
{
    assert(out->noutbits + nbits <= 32);
    out->outbits |= bits << out->noutbits;
    out->noutbits += nbits;
    while (out->noutbits >= 8) {
        put_byte(out->outbuf, out->outbits & 0xFF);
        out->outbits >>= 8;
        out->noutbits -= 8;
    }
}